

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  int len;
  int iVar13;
  ulong uVar14;
  float *pfVar15;
  uint uVar16;
  byte bVar17;
  undefined1 local_18a;
  char local_189;
  uchar rgbe [4];
  uchar scanlineheader [4];
  undefined8 local_160;
  float local_158;
  uint local_154;
  uint local_150;
  int local_14c;
  uint local_148;
  uint local_144;
  long local_140;
  long local_138;
  float *local_130;
  ulong local_128;
  long local_120;
  long local_118;
  long local_110;
  char header [66];
  char buffer [128];
  
  bVar17 = 0;
  iVar2 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    uVar14 = (ulong)(uint)x;
    local_130 = data;
    __ptr = malloc((ulong)(uint)(x * 4));
    pcVar10 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    pcVar12 = header;
    for (lVar4 = 0x42; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pcVar12 = *pcVar10;
      pcVar10 = pcVar10 + (ulong)bVar17 * -2 + 1;
      pcVar12 = pcVar12 + (ulong)bVar17 * -2 + 1;
    }
    (*s->func)(s->context,header,0x41);
    iVar2 = sprintf(buffer,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    uVar14);
    (*s->func)(s->context,buffer,iVar2);
    local_14c = comp * x;
    local_150 = (uint)x >> 8;
    local_154 = x - 0x8000;
    uVar16 = comp - 3;
    uVar11 = (ulong)(uint)x;
    local_120 = (long)__ptr + uVar11;
    local_138 = (ulong)(uint)(x * 2) + (long)__ptr;
    local_118 = (ulong)(uint)(x * 3) + (long)__ptr;
    local_140 = (long)comp << 2;
    uVar7 = 0;
    local_148 = y;
    local_144 = uVar16;
    while (lVar4 = local_138, uVar6 = (uint)uVar7, uVar6 != local_148) {
      uVar3 = ~uVar6 + local_148;
      if (stbi__flip_vertically_on_write == 0) {
        uVar3 = uVar6;
      }
      pfVar15 = local_130 + (int)(uVar3 * local_14c);
      scanlineheader[2] = (uchar)local_150;
      scanlineheader[0] = '\x02';
      scanlineheader[1] = '\x02';
      scanlineheader[3] = (uchar)x;
      uVar8 = uVar11;
      local_128 = uVar7;
      if (local_154 < 0xffff8008) {
        while (uVar8 != 0) {
          if (uVar16 < 2) {
            local_158 = pfVar15[2];
            local_160 = *(undefined8 *)pfVar15;
          }
          else {
            local_158 = *pfVar15;
            local_160 = CONCAT44(local_158,local_158);
          }
          stbiw__linear_to_rgbe(rgbe,(float *)&local_160);
          (*s->func)(s->context,rgbe,4);
          pfVar15 = (float *)((long)pfVar15 + local_140);
          uVar8 = uVar8 - 1;
        }
      }
      else {
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          if (uVar16 < 2) {
            local_158 = pfVar15[2];
            local_160 = *(undefined8 *)pfVar15;
          }
          else {
            local_158 = *pfVar15;
            local_160 = CONCAT44(local_158,local_158);
          }
          stbiw__linear_to_rgbe(rgbe,(float *)&local_160);
          *(uchar *)((long)__ptr + uVar7) = rgbe[0];
          *(uchar *)(local_120 + uVar7) = rgbe[1];
          *(uchar *)(lVar4 + uVar7) = rgbe[2];
          *(uchar *)(local_118 + uVar7) = rgbe[3];
          pfVar15 = (float *)((long)pfVar15 + local_140);
        }
        (*s->func)(s->context,scanlineheader,4);
        lVar4 = 0;
        pvVar5 = __ptr;
        while (lVar4 != 4) {
          lVar9 = lVar4 * uVar11;
          uVar16 = 0;
          local_110 = lVar4;
          while ((int)uVar16 < x) {
            uVar6 = uVar16;
            for (lVar4 = (long)(int)uVar16 + 2;
                (uVar7 = uVar14, lVar4 < (long)uVar11 &&
                ((cVar1 = *(char *)((long)pvVar5 + lVar4 + -2),
                 cVar1 != *(char *)((long)pvVar5 + lVar4 + -1) ||
                 (uVar7 = (ulong)uVar6, cVar1 != *(char *)((long)pvVar5 + lVar4)))));
                lVar4 = lVar4 + 1) {
              uVar6 = uVar6 + 1;
            }
            while( true ) {
              iVar2 = (int)uVar7;
              iVar13 = iVar2 - uVar16;
              if (iVar13 == 0 || iVar2 < (int)uVar16) break;
              if (0x7f < iVar13) {
                iVar13 = 0x80;
              }
              local_18a = (undefined1)iVar13;
              (*s->func)(s->context,&local_18a,1);
              (*s->func)(s->context,(void *)((long)__ptr + (int)uVar16 + lVar9),iVar13);
              uVar16 = uVar16 + iVar13;
            }
            if (iVar2 + 2 < x) {
              for (uVar7 = (ulong)iVar2;
                  (uVar8 = uVar14, (long)uVar7 < (long)uVar11 &&
                  (uVar8 = uVar7,
                  *(char *)((long)pvVar5 + uVar7) == *(char *)((long)__ptr + (int)uVar16 + lVar9)));
                  uVar7 = uVar7 + 1) {
              }
              for (; iVar2 = (int)uVar8 - uVar16, iVar2 != 0 && (int)uVar16 <= (int)uVar8;
                  uVar16 = iVar2 + uVar16) {
                if (0x7e < iVar2) {
                  iVar2 = 0x7f;
                }
                local_18a = *(undefined1 *)((long)__ptr + (int)uVar16 + lVar9);
                local_189 = (char)iVar2 + -0x80;
                (*s->func)(s->context,&local_189,1);
                (*s->func)(s->context,&local_18a,1);
              }
            }
          }
          pvVar5 = (void *)((long)pvVar5 + uVar11);
          uVar16 = local_144;
          lVar4 = local_110 + 1;
        }
      }
      uVar7 = (ulong)((int)local_128 + 1);
    }
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_LIB_EXT1__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}